

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O2

void __thiscall gulcalc::outputbenchmark(gulcalc *this,int event_id,bool header)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pvVar5;
  map<item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>,_std::less<item_map_key>,_std::allocator<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>_>
  *pmVar6;
  long lVar7;
  _Base_ptr p_Var8;
  undefined7 in_register_00000011;
  pointer pvVar9;
  pointer pvVar10;
  const_iterator ii;
  pointer pvVar11;
  long lVar12;
  long lVar13;
  
  if ((int)CONCAT71(in_register_00000011,header) != 0) {
    fwrite("event_id,cov,mode1,fullCorr,mode1UsedCoverageIDs,damagebindictionary_vec,item_map,coverages\n"
           ,0x5c,1,_stderr);
    return;
  }
  lVar13 = 0;
  fprintf(_stderr,"%d,",event_id);
  pvVar2 = (this->cov_).
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar1 = (this->cov_).
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (pvVar9 = pvVar1; pvVar9 < pvVar2; pvVar9 = pvVar9 + 1) {
    lVar13 = lVar13 + ((long)(pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_start >> 2);
  }
  lVar12 = 0;
  fprintf(_stderr,"%lu,",(long)pvVar2 + (lVar13 * 4 - (long)pvVar1) + 0x18);
  pvVar4 = (this->mode1_).
           super__Vector_base<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar13 = 0;
  pvVar3 = (this->mode1_).
           super__Vector_base<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (pvVar10 = pvVar3; pvVar10 < pvVar4; pvVar10 = pvVar10 + 1) {
    pvVar11 = (pvVar10->
              super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pvVar5 = (pvVar10->
             super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    lVar7 = (long)pvVar5 - (long)pvVar11;
    for (; pvVar11 < pvVar5; pvVar11 = pvVar11 + 1) {
      lVar12 = lVar12 + ((long)(pvVar11->
                               super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar11->
                               super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 4);
    }
    lVar13 = lVar13 + lVar7 / 0x18;
  }
  lVar7 = 0;
  fprintf(_stderr,"%lu,",(long)pvVar4 + (lVar12 * 0x10 - (long)pvVar3) + lVar13 * 0x18 + 0x18);
  pvVar4 = (this->fullCorr_).
           super__Vector_base<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar13 = 0;
  pvVar3 = (this->fullCorr_).
           super__Vector_base<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (pvVar10 = pvVar3; pvVar10 < pvVar4; pvVar10 = pvVar10 + 1) {
    pvVar11 = (pvVar10->
              super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pvVar5 = (pvVar10->
             super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    lVar12 = (long)pvVar5 - (long)pvVar11;
    for (; pvVar11 < pvVar5; pvVar11 = pvVar11 + 1) {
      lVar7 = lVar7 + ((long)(pvVar11->
                             super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pvVar11->
                             super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>).
                             _M_impl.super__Vector_impl_data._M_start >> 4);
    }
    lVar13 = lVar13 + lVar12 / 0x18;
  }
  lVar12 = 0;
  fprintf(_stderr,"%lu,",(long)pvVar4 + (lVar7 * 0x10 - (long)pvVar3) + lVar13 * 0x18 + 0x18);
  fprintf(_stderr,"%lu,",
          (long)(this->mode1UsedCoverageIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish +
          (0x18 - (long)(this->mode1UsedCoverageIDs_).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start));
  fprintf(_stderr,"%lu,",
          (long)(this->damagebindictionary_vec_->
                super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>).
                _M_impl.super__Vector_impl_data._M_finish +
          (0x18 - (long)(this->damagebindictionary_vec_->
                        super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>
                        )._M_impl.super__Vector_impl_data._M_start));
  pmVar6 = this->item_map_;
  for (p_Var8 = (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != &(pmVar6->_M_t)._M_impl.super__Rb_tree_header;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    lVar12 = lVar12 + ((long)p_Var8[1]._M_left - (long)p_Var8[1]._M_parent) / 0xc;
  }
  fprintf(_stderr,"%lu,",
          lVar12 * 0xc + (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_node_count * 8 + 0x30);
  fprintf(_stderr,"%lu\n",
          (long)(this->coverages_->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish +
          (0x18 - (long)(this->coverages_->super__Vector_base<float,_std::allocator<float>_>).
                        _M_impl.super__Vector_impl_data._M_start));
  return;
}

Assistant:

void gulcalc::outputbenchmark(const int event_id, bool header=false) {

	if (header) {

		fprintf(stderr, "event_id,cov,mode1,fullCorr,"
				"mode1UsedCoverageIDs,damagebindictionary_vec,"
				"item_map,coverages\n");
		return;
	}

	fprintf(stderr, "%d,", event_id);   // event_id

	// vector<vector<OASIS_FLOAT>> cov_
	size_t vec_size = 0;
	for (std::vector<std::vector<OASIS_FLOAT>>::const_iterator i = cov_.begin(); i < cov_.end(); i++) {
		vec_size += (*i).size();
	}
	fprintf(stderr, "%lu,",
		sizeof(std::vector<std::vector<OASIS_FLOAT>>) +
		  (sizeof(std::vector<OASIS_FLOAT>) * cov_.size()) +
		  (sizeof(OASIS_FLOAT) * vec_size));

	// vector<vector<vector<gulItemIDLoss>>> mode1_
	vec_size = 0;
	size_t vec2_size = 0;
	for (std::vector<std::vector<std::vector<gulItemIDLoss>>>::const_iterator i = mode1_.begin(); i < mode1_.end(); i++) {
		vec_size += (*i).size();
		for (std::vector<std::vector<gulItemIDLoss>>::const_iterator ii = (*i).begin(); ii < (*i).end(); ii++) {
			vec2_size += (*ii).size();
		}
	}
	fprintf(stderr, "%lu,",
		sizeof(std::vector<std::vector<std::vector<gulItemIDLoss>>>) +
		  (sizeof(std::vector<std::vector<gulItemIDLoss>>) * mode1_.size()) +
		  (sizeof(std::vector<gulItemIDLoss>) * vec_size) +
		  (sizeof(gulItemIDLoss) * vec2_size));

	// vector<vector<vector<gulItemIDLoss>>> fullCorr_
	vec_size = 0;
	vec2_size = 0;
	for (std::vector<std::vector<std::vector<gulItemIDLoss>>>::const_iterator i = fullCorr_.begin(); i < fullCorr_.end(); i++) {
		vec_size += (*i).size();
		for (std::vector<std::vector<gulItemIDLoss>>::const_iterator ii = (*i).begin(); ii < (*i).end(); ii++) {
			vec2_size += (*ii).size();
		}
	}
	fprintf(stderr, "%lu,",
		sizeof(std::vector<std::vector<std::vector<gulItemIDLoss>>>) +
		  (sizeof(std::vector<std::vector<gulItemIDLoss>>) * fullCorr_.size()) +
		  (sizeof(std::vector<gulItemIDLoss>) * vec_size) +
		  (sizeof(gulItemIDLoss) * vec2_size));

	// vector<int> mode1UsedCoverageIDs_
	fprintf(stderr, "%lu,",
		sizeof(std::vector<int>) +
		  (sizeof(int) * mode1UsedCoverageIDs_.size()));

	// vector<damagebindictionary> *damagebindictionary_vec_
	fprintf(stderr, "%lu,",
		sizeof(std::vector<damagebindictionary>) +
		  (sizeof(damagebindictionary) * (*damagebindictionary_vec_).size()));

	// map<item_map_key, vector<item_map_rec>> *iutem_map_
	vec_size = 0;
	for (std::map<item_map_key, std::vector<item_map_rec>>::const_iterator i = (*item_map_).begin(); i != (*item_map_).end(); i++) {
		vec_size += i->second.size();
	}
	fprintf(stderr, "%lu,",
		sizeof(std::map<item_map_key, vector<item_map_rec>>) +
		  (sizeof(item_map_key) * (*item_map_).size()) +
		  (sizeof(item_map_rec) * vec_size));

	// vector<OASIS_FLOAT> *coverages_
	fprintf(stderr, "%lu\n",
		sizeof(std::vector<OASIS_FLOAT>) +
		  (sizeof(OASIS_FLOAT) * (*coverages_).size()));

	return;

}